

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_interval.cpp
# Opt level: O0

interval_t duckdb::ToDecadesOperator::Operation<long,duckdb::interval_t>(long input)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  int iinput;
  interval_t result;
  int32_t *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  long in_stack_ffffffffffffffa0;
  allocator local_41;
  string local_40 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  uint local_10;
  
  iVar2 = Cast::Operation<long,int>(in_stack_ffffffffffffffa0);
  bVar1 = TryMultiplyOperator::Operation<int,int,int>
                    ((int32_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                     (int32_t)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (!bVar1) {
    uVar3 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_40,"Interval value %s decades out of range",&local_41);
    NumericHelper::ToString<long>((long)in_stack_ffffffffffffff68);
    OutOfRangeException::OutOfRangeException<std::__cxx11::string>
              ((OutOfRangeException *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    __cxa_throw(uVar3,&OutOfRangeException::typeinfo,OutOfRangeException::~OutOfRangeException);
  }
  return (interval_t)ZEXT416(local_10);
}

Assistant:

static inline TR Operation(TA input) {
		const auto iinput = Cast::Operation<TA, int32_t>(input);
		interval_t result;
		result.days = 0;
		result.micros = 0;
		if (!TryMultiplyOperator::Operation<int32_t, int32_t, int32_t>(iinput, Interval::MONTHS_PER_DECADE,
		                                                               result.months)) {
			throw OutOfRangeException("Interval value %s decades out of range", NumericHelper::ToString(input));
		}
		return result;
	}